

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hash.h
# Opt level: O1

iterator __thiscall
ska::detailv3::
sherwood_v3_table<const_slang::ast::Definition_*,_const_slang::ast::Definition_*,_slang::Hasher<const_slang::ast::Definition_*>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<const_slang::ast::Definition_*>_>,_std::equal_to<const_slang::ast::Definition_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::Definition_*>_>,_std::allocator<const_slang::ast::Definition_*>,_std::allocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Definition_*>_>_>
::find(sherwood_v3_table<const_slang::ast::Definition_*,_const_slang::ast::Definition_*,_slang::Hasher<const_slang::ast::Definition_*>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<const_slang::ast::Definition_*>_>,_std::equal_to<const_slang::ast::Definition_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::Definition_*>_>,_std::allocator<const_slang::ast::Definition_*>,_std::allocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Definition_*>_>_>
       *this,Definition **key)

{
  EntryPointer psVar1;
  EntryPointer psVar2;
  ulong uVar3;
  EntryPointer psVar4;
  char cVar5;
  
  uVar3 = (ulong)((long)*key * -0x61c8864680b583eb) >> ((this->hash_policy).shift & 0x3fU);
  psVar2 = this->entries;
  if (-1 < psVar2[uVar3].distance_from_desired) {
    cVar5 = '\0';
    psVar4 = psVar2 + uVar3;
    do {
      if (*key == (psVar4->field_1).value) {
        return (iterator)psVar4;
      }
      cVar5 = cVar5 + '\x01';
      psVar1 = psVar4 + 1;
      psVar4 = psVar4 + 1;
    } while (cVar5 <= psVar1->distance_from_desired);
  }
  return (iterator)(psVar2 + this->num_slots_minus_one + (long)this->max_lookups);
}

Assistant:

size_t operator()(const T& t) const { return std::hash<T>()(t); }